

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_int,_5,_6,_15,_2U>
tcu::Float<unsigned_int,5,6,15,2u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = other->m_value;
  uVar2 = 0;
  if ((((-1 < (long)uVar3) && (uVar2 = 0x7c0, uVar3 != 0x7ff0000000000000)) &&
      (((~uVar3 & 0x7ff0000000000000) != 0 || (uVar2 = 0x7ff, (uVar3 & 0xfffffffffffff) == 0)))) &&
     (uVar2 = 0, uVar3 != 0)) {
    iVar1 = Float<unsigned_long,_11,_52,_1023,_3U>::exponent(other);
    uVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::mantissa(other);
    iVar1 = -iVar1;
    for (; (uVar3 & 0x10000000000000) == 0; uVar3 = uVar3 * 2) {
      iVar1 = iVar1 + 1;
    }
    if (-iVar1 < -0xe) {
      if ((uint)-iVar1 < 0xffffffeb) {
        uVar2 = (uint)(other->m_value >> 0x34) & 0x800;
      }
      else {
        uVar2 = (uint)(~(-1L << ((char)iVar1 + 0x1fU & 0x3f)) + uVar3 +
                       (ulong)((uVar3 >> ((ulong)(iVar1 + 0x20U) & 0x3f) & 1) != 0) >>
                      ((byte)(iVar1 + 0x20U) & 0x3f));
      }
    }
    else {
      uVar3 = (uVar3 & 0xffefffffffffffff) + 0x1fffffffffff + (ulong)((uVar3 >> 0x2e & 1) != 0);
      uVar4 = uVar3 & 0x10000000000000;
      iVar1 = (uint)(uVar4 >> 0x34) - iVar1;
      if (iVar1 < 0x10) {
        uVar2 = (uint)(uVar3 >> 0x2e);
        if (uVar4 != 0) {
          uVar2 = 0;
        }
        uVar2 = uVar2 | iVar1 * 0x40 + 0x3c0U;
      }
      else {
        uVar2 = (uint)(other->m_value >> 0x3f) << 0xb | 0x7c0;
      }
    }
  }
  return (Float<unsigned_int,_5,_6,_15,_2U>)uVar2;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}